

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

bool __thiscall MD5::checkDataChecksum(MD5 *this,char *checksum,char *buf,size_t len)

{
  bool bVar1;
  undefined1 local_40 [8];
  string actual_checksum;
  size_t len_local;
  char *buf_local;
  char *checksum_local;
  
  actual_checksum.field_2._8_8_ = buf;
  getDataChecksum_abi_cxx11_((string *)local_40,(MD5 *)checksum,buf,len);
  bVar1 = std::operator==((char *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool
MD5::checkDataChecksum(char const* const checksum, char const* buf, size_t len)
{
    std::string actual_checksum = getDataChecksum(buf, len);
    return (checksum == actual_checksum);
}